

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient_detector.cc
# Opt level: O2

void __thiscall
webrtc::TransientDetector::TransientDetector(TransientDetector *this,int sample_rate_hz)

{
  deque<float,_std::allocator<float>_> *pdVar1;
  WPDTree *this_00;
  MovingMoments *this_01;
  pointer pfVar2;
  int iVar3;
  ulong uVar4;
  ulong data_length;
  long lVar5;
  bool bVar6;
  float local_5c;
  deque<float,_std::allocator<float>_> *local_58;
  unique_ptr<float[],_std::default_delete<float[]>_> *local_50;
  unique_ptr<float[],_std::default_delete<float[]>_> *local_48;
  unique_ptr<webrtc::WPDTree,_std::default_delete<webrtc::WPDTree>_> *local_40;
  unique_ptr<webrtc::MovingMoments,_std::default_delete<webrtc::MovingMoments>_> *local_38;
  
  this->samples_per_chunk_ = (long)(sample_rate_hz / 100);
  local_40 = &this->wpd_tree_;
  (this->wpd_tree_)._M_t.
  super___uniq_ptr_impl<webrtc::WPDTree,_std::default_delete<webrtc::WPDTree>_>._M_t.
  super__Tuple_impl<0UL,_webrtc::WPDTree_*,_std::default_delete<webrtc::WPDTree>_>.
  super__Head_base<0UL,_webrtc::WPDTree_*,_false>._M_head_impl = (WPDTree *)0x0;
  local_38 = this->moving_moments_;
  local_48 = &this->first_moments_;
  local_50 = &this->second_moments_;
  pdVar1 = &this->previous_results_;
  memset(local_38,0,0x90);
  std::_Deque_base<float,_std::allocator<float>_>::_Deque_base
            (&pdVar1->super__Deque_base<float,_std::allocator<float>_>);
  this->chunks_at_startup_left_to_delete_ = 3;
  this->reference_energy_ = 1.0;
  this->using_reference_ = false;
  local_58 = pdVar1;
  if ((((sample_rate_hz != 8000) && (sample_rate_hz != 16000)) && (sample_rate_hz != 32000)) &&
     (sample_rate_hz != 48000)) {
    __assert_fail("sample_rate_hz == ts::kSampleRate8kHz || sample_rate_hz == ts::kSampleRate16kHz || sample_rate_hz == ts::kSampleRate32kHz || sample_rate_hz == ts::kSampleRate48kHz"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/transient/transient_detector.cc"
                  ,0x2a,"webrtc::TransientDetector::TransientDetector(int)");
  }
  uVar4 = this->samples_per_chunk_;
  data_length = uVar4 & 0xfffffffffffffff8;
  this->samples_per_chunk_ = data_length;
  this->tree_leaves_data_length_ = uVar4 >> 3;
  this_00 = (WPDTree *)operator_new(0x18);
  iVar3 = 3;
  WPDTree::WPDTree(this_00,data_length,(float *)kDaubechies8HighPassCoefficients,
                   (float *)kDaubechies8LowPassCoefficients,0x10,3);
  std::__uniq_ptr_impl<webrtc::WPDTree,_std::default_delete<webrtc::WPDTree>_>::reset
            ((__uniq_ptr_impl<webrtc::WPDTree,_std::default_delete<webrtc::WPDTree>_> *)local_40,
             this_00);
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 8) {
    this_01 = (MovingMoments *)operator_new(0x60);
    MovingMoments::MovingMoments(this_01,(ulong)(uint)(sample_rate_hz * 0x1e) / 1000 >> 3);
    std::__uniq_ptr_impl<webrtc::MovingMoments,_std::default_delete<webrtc::MovingMoments>_>::reset
              ((__uniq_ptr_impl<webrtc::MovingMoments,_std::default_delete<webrtc::MovingMoments>_>
                *)((long)&(local_38->_M_t).
                          super___uniq_ptr_impl<webrtc::MovingMoments,_std::default_delete<webrtc::MovingMoments>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_webrtc::MovingMoments_*,_std::default_delete<webrtc::MovingMoments>_>
                          .super__Head_base<0UL,_webrtc::MovingMoments_*,_false>._M_head_impl +
                  lVar5),this_01);
  }
  pfVar2 = (pointer)operator_new__(-(ulong)(this->tree_leaves_data_length_ >> 0x3e != 0) |
                                   this->tree_leaves_data_length_ << 2);
  std::__uniq_ptr_impl<float,_std::default_delete<float[]>_>::reset
            ((__uniq_ptr_impl<float,_std::default_delete<float[]>_> *)local_48,pfVar2);
  uVar4 = 0xffffffffffffffff;
  if (this->tree_leaves_data_length_ < 0x4000000000000000) {
    uVar4 = this->tree_leaves_data_length_ * 4;
  }
  pfVar2 = (pointer)operator_new__(uVar4);
  std::__uniq_ptr_impl<float,_std::default_delete<float[]>_>::reset
            ((__uniq_ptr_impl<float,_std::default_delete<float[]>_> *)local_50,pfVar2);
  pdVar1 = local_58;
  while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
    local_5c = 0.0;
    std::deque<float,_std::allocator<float>_>::emplace_back<float>(pdVar1,&local_5c);
  }
  return;
}

Assistant:

TransientDetector::TransientDetector(int sample_rate_hz)
    : samples_per_chunk_(sample_rate_hz * ts::kChunkSizeMs / 1000),
      last_first_moment_(),
      last_second_moment_(),
      chunks_at_startup_left_to_delete_(kChunksAtStartupLeftToDelete),
      reference_energy_(1.f),
      using_reference_(false) {
  assert(sample_rate_hz == ts::kSampleRate8kHz ||
         sample_rate_hz == ts::kSampleRate16kHz ||
         sample_rate_hz == ts::kSampleRate32kHz ||
         sample_rate_hz == ts::kSampleRate48kHz);
  int samples_per_transient = sample_rate_hz * kTransientLengthMs / 1000;
  // Adjustment to avoid data loss while downsampling, making
  // |samples_per_chunk_| and |samples_per_transient| always divisible by
  // |kLeaves|.
  samples_per_chunk_ -= samples_per_chunk_ % kLeaves;
  samples_per_transient -= samples_per_transient % kLeaves;

  tree_leaves_data_length_ = samples_per_chunk_ / kLeaves;
  wpd_tree_.reset(new WPDTree(samples_per_chunk_,
                              kDaubechies8HighPassCoefficients,
                              kDaubechies8LowPassCoefficients,
                              kDaubechies8CoefficientsLength,
                              kLevels));
  for (size_t i = 0; i < kLeaves; ++i) {
    moving_moments_[i].reset(
        new MovingMoments(samples_per_transient / kLeaves));
  }

  first_moments_.reset(new float[tree_leaves_data_length_]);
  second_moments_.reset(new float[tree_leaves_data_length_]);

  for (int i = 0; i < kChunksAtStartupLeftToDelete; ++i) {
    previous_results_.push_back(0.f);
  }
}